

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

Abc_Obj_t * Ver_ParseFindNet(Abc_Ntk_t *pNtk,char *pName)

{
  int iVar1;
  Abc_Obj_t *pObj;
  char *pName_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtk_local = (Abc_Ntk_t *)Abc_NtkFindNet(pNtk,pName);
  if (pNtk_local == (Abc_Ntk_t *)0x0) {
    iVar1 = strcmp(pName,"1\'b0");
    if ((iVar1 == 0) || (iVar1 = strcmp(pName,"1\'bx"), iVar1 == 0)) {
      pNtk_local = (Abc_Ntk_t *)Abc_NtkFindOrCreateNet(pNtk,"1\'b0");
    }
    else {
      iVar1 = strcmp(pName,"1\'b1");
      if (iVar1 == 0) {
        pNtk_local = (Abc_Ntk_t *)Abc_NtkFindOrCreateNet(pNtk,"1\'b1");
      }
      else {
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
    }
  }
  return (Abc_Obj_t *)pNtk_local;
}

Assistant:

Abc_Obj_t * Ver_ParseFindNet( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pObj;
    if ( (pObj = Abc_NtkFindNet(pNtk, pName)) )
        return pObj;
    if ( !strcmp( pName, "1\'b0" ) || !strcmp( pName, "1\'bx" ) )
        return Abc_NtkFindOrCreateNet( pNtk, "1\'b0" );
    if ( !strcmp( pName, "1\'b1" ) )
        return Abc_NtkFindOrCreateNet( pNtk, "1\'b1" );
    return NULL;
}